

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O0

void __thiscall
FactorisedJoin::getRelationOrdering(FactorisedJoin *this,int *left,DTreeNode *node,int *ordering)

{
  size_type sVar1;
  allocator_type *__a;
  reference pvVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  undefined4 *in_RCX;
  long in_RDX;
  long in_RSI;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_RDI;
  pair<int,_double> pVar6;
  int k_1;
  int j;
  int i;
  int k;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> values;
  int numberOfRelations;
  int nodeID;
  double *in_stack_ffffffffffffff48;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *this_00;
  int *in_stack_ffffffffffffff50;
  undefined1 *__n;
  int local_88;
  pair<int,_double> local_70;
  int local_60;
  int local_5c;
  int local_58;
  undefined1 local_41;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_40;
  int local_28;
  int local_24;
  undefined4 *local_20;
  long local_10;
  
  local_24 = *(int *)(in_RDX + 0x20);
  local_20 = in_RCX;
  local_10 = in_RSI;
  sVar1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     ((long)in_RDI[2].
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (long)local_24 * 0x18));
  local_28 = (int)sVar1;
  if (local_28 == 1) {
    *local_20 = 0;
  }
  else {
    __a = (allocator_type *)(long)local_28;
    __n = &local_41;
    std::allocator<std::pair<int,_double>_>::allocator
              ((allocator<std::pair<int,_double>_> *)0x1ba4de);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
              (in_RDI,(size_type)__n,__a);
    std::allocator<std::pair<int,_double>_>::~allocator
              ((allocator<std::pair<int,_double>_> *)0x1ba4fe);
    for (local_58 = 0; local_58 < local_28; local_58 = local_58 + 1) {
      pvVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          ((long)in_RDI[2].
                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (long)local_24 * 0x18),
                          (long)local_58);
      local_5c = pvVar2->first;
      pvVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          ((long)in_RDI[2].
                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (long)local_24 * 0x18),
                          (long)local_58);
      local_60 = pvVar2->second;
      std::vector<double_*,_std::allocator<double_*>_>::operator[]
                ((vector<double_*,_std::allocator<double_*>_> *)
                 ((long)in_RDI[1].
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)local_5c * 0x18),
                 (long)*(int *)(local_10 + (long)local_5c * 4));
      pVar6 = std::make_pair<int&,double&>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff50 = (int *)pVar6.second;
      local_70.first = pVar6.first;
      local_70.second = (double)in_stack_ffffffffffffff50;
      pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[](&local_40,(long)local_58);
      std::pair<int,_double>::operator=(pvVar3,&local_70);
    }
    this_00 = &local_40;
    iVar4 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                      (this_00);
    iVar5 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                      (this_00);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,FactorisedJoin::sort_pred>
              (iVar4._M_current,iVar5._M_current);
    for (local_88 = 0; local_88 < local_28; local_88 = local_88 + 1) {
      pvVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[](&local_40,(long)local_88);
      local_20[local_88] = pvVar3->first;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)__a);
  }
  return;
}

Assistant:

void FactorisedJoin::getRelationOrdering(int* left, DTreeNode* node, int* ordering)
{
    int nodeID = node->_id;
    int numberOfRelations = _ids[nodeID].size();

    if (numberOfRelations == 1)
    {
        ordering[0] = 0;
        return;
    }

    vector<pair<int, double> > values(numberOfRelations);

    for (int k = 0; k < numberOfRelations; ++k)
    {
        int i = _ids[nodeID][k].first;
        int j = _ids[nodeID][k].second;
        values[k] = make_pair(k, _data[i][left[i]][j]);
    }

    sort(values.begin(), values.end(), sort_pred());

    for (int k = 0; k < numberOfRelations; ++k)
        ordering[k] = values[k].first;
}